

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_18c208e::HandleDirectoryMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  cmMakefile *pcVar1;
  int iVar2;
  PolicyStatus PVar3;
  string *in_base;
  cmGlobalGenerator *this;
  cmMakefile *this_00;
  cmValue value;
  char *value_00;
  PolicyID id;
  string dir;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = status->Makefile;
  if (name->_M_string_length != 0) {
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    cmsys::SystemTools::CollapseFullPath(&local_70,name,in_base);
    this = cmMakefile::GetGlobalGenerator(status->Makefile);
    this_00 = cmGlobalGenerator::FindMakefile(this,&local_70);
    if (this_00 == (cmMakefile *)0x0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,
                 "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                 ,"");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)propertyName);
  if (iVar2 == 0) {
    PVar3 = cmMakefile::GetPolicyStatus(this_00,CMP0059,false);
    if (PVar3 != OLD) {
      if (PVar3 != WARN) goto LAB_0046a327;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_70,(cmPolicies *)&DAT_0000003b,id);
      cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar1 = status->Makefile;
    value_00 = cmMakefile::GetDefineFlagsCMP0059(this_00);
    (anonymous_namespace)::StoreResult<char_const*>(infoType,pcVar1,variable,value_00);
  }
  else {
LAB_0046a327:
    pcVar1 = status->Makefile;
    value = cmMakefile::GetProperty(this_00,propertyName);
    StoreResult<cmValue>(infoType,pcVar1,variable,value);
  }
  return true;
}

Assistant:

bool HandleDirectoryMode(cmExecutionStatus& status, const std::string& name,
                         OutType infoType, const std::string& variable,
                         const std::string& propertyName)
{
  // Default to the current directory.
  cmMakefile* mf = &status.GetMakefile();

  // Lookup the directory if given.
  if (!name.empty()) {
    // Construct the directory name.  Interpret relative paths with
    // respect to the current directory.
    std::string dir = cmSystemTools::CollapseFullPath(
      name, status.GetMakefile().GetCurrentSourceDirectory());

    // Lookup the generator.
    mf = status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
    if (!mf) {
      // Could not find the directory.
      status.SetError(
        "DIRECTORY scope provided but requested directory was not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
  }

  if (propertyName == "DEFINITIONS") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0059)) {
      case cmPolicies::WARN:
        mf->IssueMessage(MessageType::AUTHOR_WARNING,
                         cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return StoreResult(infoType, status.GetMakefile(), variable,
                           mf->GetDefineFlagsCMP0059());
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
    }
  }

  // Get the property.
  return StoreResult(infoType, status.GetMakefile(), variable,
                     mf->GetProperty(propertyName));
}